

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

Var __thiscall
Js::InterpreterStackFrame::
OP_LdSlot<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout)

{
  ushort uVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  undefined4 *puVar5;
  
  uVar1 = (playout->super_OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).SlotIndex
  ;
  sourceContextId = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
  lVar2 = *(long *)(this + 0x88);
  if (*(long *)(lVar2 + 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ClosureRangeCheckPhase,sourceContextId,
                            *(LocalFunctionId *)(*(long *)(lVar2 + 0x10) + 0x10));
  if ((!bVar4) && (*instance <= (ulong)(uVar1 - 2))) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  return *(Var *)((long)instance + (ulong)uVar1 * 8);
}

Assistant:

Var InterpreterStackFrame::OP_LdSlot(Var instance, const unaligned T* playout)
    {
        return OP_LdSlot(instance, playout->SlotIndex);
    }